

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateParseTable
          (MessageGenerator *this,Printer *printer,size_t offset,size_t aux_offset)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  FileOptions_OptimizeMode FVar4;
  char *pcVar5;
  int iVar6;
  int max_field_number;
  Iterator __begin3;
  Formatter format;
  Iterator __end3;
  int local_9c;
  Iterator local_98;
  size_t local_88;
  size_t local_80;
  Formatter local_78;
  Iterator local_40;
  
  local_88 = aux_offset;
  local_80 = offset;
  local_78.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_78.vars_._M_t,&(this->variables_)._M_t);
  bVar1 = this->table_driven_;
  if (bVar1 == false) {
    Formatter::operator()<>(&local_78,"{ nullptr, nullptr, 0, -1, -1, -1, -1, nullptr, false },\n");
  }
  else {
    iVar6 = 0;
    local_9c = 0;
    local_98.descriptor = this->descriptor_;
    local_98.idx = 0;
    local_40.idx = *(int *)(local_98.descriptor + 4);
    local_40.descriptor = local_98.descriptor;
    while( true ) {
      bVar3 = operator==(&local_98,&local_40);
      if (bVar3) break;
      iVar2 = *(int *)(*(long *)(local_98.descriptor + 0x28) + 4 + (long)local_98.idx * 0x48);
      if (iVar6 < iVar2) {
        iVar6 = iVar2;
        local_9c = iVar2;
      }
      local_98.idx = local_98.idx + 1;
    }
    Formatter::operator()<>(&local_78,"{\n");
    io::Printer::Indent(local_78.printer_);
    Formatter::operator()
              (&local_78,"$tablename$::entries + $1$,\n$tablename$::aux + $2$,\n$3$,\n",&local_80,
               &local_88,&local_9c);
    pcVar5 = "PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_),\n";
    if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar5 = "-1,\n";
    }
    Formatter::operator()<>(&local_78,pcVar5);
    pcVar5 = "-1,  // no _oneof_case_\n";
    if (0 < *(int *)(this->descriptor_ + 0x6c)) {
      pcVar5 = "PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_),\n";
    }
    Formatter::operator()<>(&local_78,pcVar5);
    pcVar5 = "-1,  // no _extensions_\n";
    if (0 < *(int *)(this->descriptor_ + 0x78)) {
      pcVar5 = "PROTOBUF_FIELD_OFFSET($classtype$, _extensions_),\n";
    }
    Formatter::operator()<>(&local_78,pcVar5);
    Formatter::operator()<>
              (&local_78,
               "PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n&$package_ns$::_$classname$_default_instance_,\n"
              );
    FVar4 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),&this->options_,
                           (bool *)0x0);
    pcVar5 = "true,\n";
    if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      pcVar5 = "false,\n";
    }
    Formatter::operator()<>(&local_78,pcVar5);
    io::Printer::Outdent(local_78.printer_);
    Formatter::operator()<>(&local_78,"},\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_78.vars_._M_t);
  return bVar1;
}

Assistant:

bool MessageGenerator::GenerateParseTable(io::Printer* printer, size_t offset,
                                          size_t aux_offset) {
  Formatter format(printer, variables_);

  if (!table_driven_) {
    format("{ nullptr, nullptr, 0, -1, -1, -1, -1, nullptr, false },\n");
    return false;
  }

  int max_field_number = 0;
  for (auto field : FieldRange(descriptor_)) {
    if (max_field_number < field->number()) {
      max_field_number = field->number();
    }
  }

  format("{\n");
  format.Indent();

  format(
      "$tablename$::entries + $1$,\n"
      "$tablename$::aux + $2$,\n"
      "$3$,\n",
      offset, aux_offset, max_field_number);

  if (has_bit_indices_.empty()) {
    // If no fields have hasbits, then _has_bits_ does not exist.
    format("-1,\n");
  } else {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_),\n");
  }

  if (descriptor_->real_oneof_decl_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_),\n");
  } else {
    format("-1,  // no _oneof_case_\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _extensions_),\n");
  } else {
    format("-1,  // no _extensions_\n");
  }

  // TODO(ckennelly): Consolidate this with the calculation for
  // AuxiliaryParseTableField.
  format(
      "PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n"
      "&$package_ns$::_$classname$_default_instance_,\n");

  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    format("true,\n");
  } else {
    format("false,\n");
  }

  format.Outdent();
  format("},\n");
  return true;
}